

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef
BinaryenArrayFill(BinaryenModuleRef module,BinaryenExpressionRef ref,BinaryenExpressionRef index,
                 BinaryenExpressionRef value,BinaryenExpressionRef size)

{
  ArrayFill *pAVar1;
  Builder local_10;
  
  local_10.wasm = module;
  pAVar1 = wasm::Builder::makeArrayFill(&local_10,ref,index,value,size);
  return (BinaryenExpressionRef)pAVar1;
}

Assistant:

BinaryenExpressionRef BinaryenArrayFill(BinaryenModuleRef module,
                                        BinaryenExpressionRef ref,
                                        BinaryenExpressionRef index,
                                        BinaryenExpressionRef value,
                                        BinaryenExpressionRef size) {
  return static_cast<Expression*>(Builder(*(Module*)module)
                                    .makeArrayFill((Expression*)ref,
                                                   (Expression*)index,
                                                   (Expression*)value,
                                                   (Expression*)size));
}